

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

UInt __thiscall Json::Value::asUInt(Value *this)

{
  double dVar1;
  uint uVar2;
  
  uVar2 = (uint)(byte)this->field_0x8;
  switch(this->field_0x8) {
  case 0:
    break;
  case 1:
    uVar2 = (this->value_).uint_;
    if ((int)uVar2 < 0) {
      jbcoin::Throw<std::runtime_error,char_const(&)[58]>
                ((char (*) [58])"Negative integer can not be converted to unsigned integer");
    }
    break;
  case 2:
    uVar2 = (this->value_).uint_;
    break;
  case 3:
    dVar1 = (this->value_).real_;
    if ((dVar1 < 0.0) || (4294967295.0 < dVar1)) {
      jbcoin::Throw<std::runtime_error,char_const(&)[35]>
                ((char (*) [35])"Real out of unsigned integer range");
    }
    uVar2 = (uint)(long)dVar1;
    break;
  case 4:
    uVar2 = beast::lexicalCastThrow<unsigned_int,char*>((this->value_).string_);
    return uVar2;
  case 5:
    uVar2 = (uint)(this->value_).bool_;
    break;
  case 6:
  case 7:
    jbcoin::Throw<std::runtime_error,char_const(&)[32]>
              ((char (*) [32])"Type is not convertible to uint");
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/json/impl/json_value.cpp"
                  ,0x25f,"Value::UInt Json::Value::asUInt() const");
  }
  return uVar2;
}

Assistant:

Value::UInt
Value::asUInt () const
{
    switch ( type_ )
    {
    case nullValue:
        return 0;

    case intValue:
        JSON_ASSERT_MESSAGE ( value_.int_ >= 0, "Negative integer can not be converted to unsigned integer" );
        return value_.int_;

    case uintValue:
        return value_.uint_;

    case realValue:
        JSON_ASSERT_MESSAGE ( value_.real_ >= 0  &&  value_.real_ <= maxUInt,  "Real out of unsigned integer range" );
        return UInt ( value_.real_ );

    case booleanValue:
        return value_.bool_ ? 1 : 0;

    case stringValue:
        return beast::lexicalCastThrow <unsigned int> (value_.string_);

    case arrayValue:
    case objectValue:
        JSON_ASSERT_MESSAGE ( false, "Type is not convertible to uint" );

    default:
        JSON_ASSERT_UNREACHABLE;
    }

    return 0; // unreachable;
}